

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

Object * compareInstance(Object *__return_storage_ptr__,Logical expr,Environment *env)

{
  Literal l;
  Literal l_00;
  undefined8 uVar1;
  long local_f0;
  Literal ret_1;
  Instance *o;
  Literal lit;
  Literal ret;
  Object b;
  Object a;
  Environment *env_local;
  
  uVar1 = expr._0_8_;
  resolveExpression((Object *)&b.field_1.routine.code.statements,expr.left,env);
  resolveExpression((Object *)&ret.field_2,expr.right,env);
  if ((b.field_1._48_4_ == 5) && (ret.field_2.lVal == 5)) {
    ret.line = 0;
    if (expr.op.type == TOKEN_BANG_EQUAL) {
      ret.line = (int)(a._0_8_ != b._0_8_);
    }
    else if (expr.op.type == TOKEN_EQUAL_EQUAL) {
      ret.line = (int)(a._0_8_ == b._0_8_);
    }
    else {
      printf("\x1b[31m\n[Runtime Error] [Line:%d] Can\'t compare container instances!\x1b[0m",
             (ulong)(uint)expr.line);
      stop();
    }
    l_00.type = 3;
    l_00.line = expr.line;
    l_00.field_2.lVal = ret.line;
    l_00.field_2.iVal._4_4_ = ret.type;
    fromLiteral(__return_storage_ptr__,l_00);
  }
  else if (((b.field_1._48_4_ == 5) && (ret.field_2.lVal == 1)) ||
          ((b.field_1._48_4_ == 1 && (ret.field_2.lVal == 5)))) {
    if (b.field_1._48_4_ == 1) {
      o._4_4_ = a._4_4_;
    }
    else {
      o._4_4_ = b._4_4_;
    }
    if (b.field_1._48_4_ == 5) {
      local_f0 = a._0_8_;
    }
    else {
      local_f0 = b._0_8_;
    }
    if (o._4_4_ != 4) {
      printf("\x1b[31m\n[Runtime Error] [Line:%d] Unable to compare between literal and instances!\x1b[0m"
             ,uVar1 & 0xffffffff);
      stop();
    }
    ret_1.line = 0;
    if (expr.op.type == TOKEN_BANG_EQUAL) {
      ret_1.line = (int)(local_f0 != 0);
    }
    else if (expr.op.type == TOKEN_EQUAL_EQUAL) {
      ret_1.line = (int)(local_f0 == 0);
    }
    else {
      printf("\x1b[31m\n[Runtime Error] [Line:%d] Null can\'t be compared!\x1b[0m",
             (ulong)(uint)expr.line);
      stop();
    }
    l.type = 3;
    l.line = expr.line;
    l.field_2.lVal = ret_1.line;
    l.field_2.iVal._4_4_ = ret_1.type;
    fromLiteral(__return_storage_ptr__,l);
  }
  else {
    memcpy(__return_storage_ptr__,&nullObject,0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

static Object compareInstance(Logical expr, Environment *env){
    Object a = resolveExpression(expr.left, env);
    Object b = resolveExpression(expr.right, env);
    if(a.type == OBJECT_INSTANCE && b.type == OBJECT_INSTANCE){
        Literal ret = {expr.line, LIT_LOGICAL, {0}};
        switch(expr.op.type){
            case TOKEN_EQUAL_EQUAL:
                ret.lVal = a.instance == b.instance;
                break;
            case TOKEN_BANG_EQUAL:
                ret.lVal = a.instance != b.instance;
                break;
            default:
                printf(runtime_error("Can't compare container instances!"), expr.line);
                stop();
                break;
        }
        return fromLiteral(ret);
    }
    else if((a.type == OBJECT_INSTANCE && b.type == OBJECT_LITERAL)
            || (a.type == OBJECT_LITERAL && b.type == OBJECT_INSTANCE)){
        Literal lit = a.type == OBJECT_LITERAL ? a.literal : b.literal;
        Instance* o = a.type == OBJECT_INSTANCE ? a.instance : b.instance;
        if(lit.type != LIT_NULL){
            printf(runtime_error("Unable to compare between literal and instances!"), expr.line);
            stop();
        }
        Literal ret = {expr.line, LIT_LOGICAL, {0}};
        switch(expr.op.type){
            case TOKEN_EQUAL_EQUAL: 
                ret.lVal = o == NULL;
                break;
            case TOKEN_BANG_EQUAL:
                ret.lVal = o != NULL;
                break;
            default:
                printf(runtime_error("Null can't be compared!"), expr.line);
                stop();
                break;
        }
        return fromLiteral(ret);
    }
    return nullObject;
}